

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall
Fl_Text_Display::draw_text(Fl_Text_Display *this,int left,int top,int width,int height)

{
  int iVar1;
  int local_3c;
  int local_30;
  int line;
  int lastLine;
  int firstLine;
  int fontHeight;
  int height_local;
  int width_local;
  int top_local;
  int left_local;
  Fl_Text_Display *this_local;
  
  if (this->mMaxsize == 0) {
    local_3c = this->textsize_;
  }
  else {
    local_3c = this->mMaxsize;
  }
  local_30 = (((top - (this->text_area).y) - local_3c) + 1) / local_3c;
  iVar1 = (this->text_area).y;
  fl_push_clip(left,top,width,height);
  for (; local_30 <= ((top + height) - iVar1) / local_3c + 1; local_30 = local_30 + 1) {
    draw_vline(this,local_30,left,left + width,0,0x7fffffff);
  }
  fl_pop_clip();
  return;
}

Assistant:

void Fl_Text_Display::draw_text( int left, int top, int width, int height ) {
  int fontHeight, firstLine, lastLine, line;

  /* find the line number range of the display */
  fontHeight = mMaxsize ? mMaxsize : textsize_;
  firstLine = ( top - text_area.y - fontHeight + 1 ) / fontHeight;
  lastLine = ( top + height - text_area.y ) / fontHeight + 1;

  fl_push_clip( left, top, width, height );

  /* draw the lines */
  for ( line = firstLine; line <= lastLine; line++ )
    draw_vline( line, left, left + width, 0, INT_MAX );

  fl_pop_clip();
}